

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Search.cpp
# Opt level: O1

int LinearSearch(int *a,int n,int x)

{
  ulong uVar1;
  
  if (0 < n) {
    uVar1 = 0;
    do {
      if (a[uVar1] == x) {
        return (int)uVar1;
      }
      uVar1 = uVar1 + 1;
    } while ((uint)n != uVar1);
  }
  return -1;
}

Assistant:

int LinearSearch(int * a, int n, int x)
{
	int i = 0;
	while ( i < n && a[i] != x)
		i++;
	return (i < n) ? i : -1;
}